

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O3

bool __thiscall ExecutorRegVm::Run(ExecutorRegVm *this,uint functionID,char *arguments)

{
  ExternFuncInfo *function;
  uint uVar1;
  uint *__dest;
  ExternFuncInfo *pEVar2;
  uint uVar3;
  RegVmReturnType RVar4;
  int iVar5;
  uint uVar6;
  Linker *pLVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar11;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr;
  RegVmRegister *pRVar12;
  byte bVar13;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar14;
  char *pcVar15;
  RegVmCmd *instruction;
  bool bVar16;
  RegVmReturnType local_54;
  RegVmCmd *local_38;
  
  pLVar7 = this->exLinker;
  if ((pLVar7->exRegVmCode).count == 0) {
    this->codeRunning = false;
    this->callContinue = false;
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: module contains no code");
    this->execErrorMessage = this->execErrorBuffer;
    (this->execErrorObject).typeID = 0;
    (this->execErrorObject).ptr = (char *)0x0;
    return false;
  }
  if ((functionID == 0xffffffff) || (this->codeRunning == false)) {
    InitExecution(this);
    pLVar7 = this->exLinker;
    uVar1 = (pLVar7->exRegVmCode).count;
    this->codeRunning = true;
    if (uVar1 != 0) goto LAB_00243032;
LAB_00243620:
    pcVar15 = 
    "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
    ;
    goto LAB_0024364c;
  }
  this->codeRunning = true;
LAB_00243032:
  instruction = (pLVar7->exRegVmCode).data;
  this->codeBase = instruction;
  uVar1 = this->lastFinalReturn;
  uVar6 = (this->dataStack).count;
  this->lastFinalReturn = (this->callStack).count;
  if (functionID == 0xffffffff) {
    if (uVar6 < pLVar7->globalVarSize) {
      __assert_fail("dataStack.size() >= exLinker->globalVarSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x115,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    regFilePtr = &this->regFileLastTop->field_0;
    paVar14 = regFilePtr + 0x100;
    local_54 = rvrVoid;
    memset((this->dataStack).data,0,(ulong)pLVar7->globalVarSize);
    *regFilePtr = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
    regFilePtr[2] =
         (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
    regFilePtr[3].longValue = (int64_t)regFilePtr;
    sVar8 = 0x7e0;
LAB_002433f1:
    memset(regFilePtr + 4,0,sVar8);
    pRVar12 = this->regFileLastTop;
    this->regFileLastTop = (RegVmRegister *)paVar14;
    if (instruction == (RegVmCmd *)0x0) {
      bVar13 = 0;
      RVar4 = local_54;
    }
    else {
      RVar4 = RunCode(instruction,(RegVmRegister *)regFilePtr,this,this->codeBase);
      bVar13 = 0;
    }
LAB_0024343c:
    this->regFileLastTop = pRVar12;
    if ((this->dataStack).count < uVar6) {
      __assert_fail("newSize <= count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x8e,
                    "void FastVector<char, true, true>::shrink(unsigned int) [T = char, zeroNewMemory = true, skipConstructor = true]"
                   );
    }
    (this->dataStack).count = uVar6;
    if (RVar4 == rvrError) {
LAB_0024348c:
      if (this->lastFinalReturn == 0) {
        pcVar15 = this->execErrorBuffer;
        sVar8 = strlen(pcVar15);
        pcVar15 = pcVar15 + sVar8;
        iVar5 = NULLC::SafeSprintf(pcVar15,(long)(0x10000 - (int)sVar8),"\r\nCall stack:\r\n");
        uVar6 = GetCallStackAddress(this,0);
        if (uVar6 != 0) {
          pcVar15 = pcVar15 + iVar5;
          uVar10 = 1;
          do {
            uVar6 = PrintStackFrame(uVar6,pcVar15,
                                    (*(int *)&this->execErrorBuffer - (int)pcVar15) + 0x10000,false)
            ;
            pcVar15 = pcVar15 + uVar6;
            uVar6 = GetCallStackAddress(this,uVar10);
            uVar10 = uVar10 + 1;
          } while (uVar6 != 0);
        }
      }
      this->execErrorFinalReturnDepth = this->lastFinalReturn;
      this->lastFinalReturn = uVar1;
      this->callContinue = false;
      this->codeRunning = false;
      return false;
    }
    if ((local_54 != rvrVoid) && (bVar16 = local_54 != RVar4, RVar4 = local_54, bVar16)) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                    ,0x136,"bool ExecutorRegVm::Run(unsigned int, const char *)");
    }
    if (bVar13 != 0) goto LAB_0024348c;
    this->lastFinalReturn = uVar1;
    if (functionID == 0xffffffff) {
      this->tempStackType = 0;
      if (RVar4 == rvrDouble) {
        this->tempStackType = 7;
        return true;
      }
      if (RVar4 != rvrLong) {
        if (RVar4 != rvrInt) {
          return true;
        }
        this->tempStackType = 4;
        return true;
      }
      this->tempStackType = 5;
      return true;
    }
    if (functionID < this->exFunctions->count) {
      uVar1 = this->exFunctions->data[functionID].funcType;
      if (uVar1 < this->exTypes->count) {
        uVar1 = this->exTypes->data[uVar1].field_11.subType;
        if (uVar1 < (this->exLinker->exTypeExtra).count) {
          this->tempStackType = (this->exLinker->exTypeExtra).data[uVar1].type;
          return true;
        }
        pcVar15 = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      else {
        pcVar15 = 
        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
      }
      goto LAB_0024364c;
    }
  }
  else if (functionID < this->exFunctions->count) {
    __dest = this->tempStackArrayBase;
    pEVar2 = this->exFunctions->data;
    function = pEVar2 + functionID;
    uVar10 = pEVar2[functionID].regVmAddress;
    local_54 = GetFunctionVmReturnType(function,this->exTypes->data,(pLVar7->exTypeExtra).data);
    if ((ulong)uVar10 == 0xffffffff) {
      memcpy(__dest,arguments,(ulong)function->argumentSize);
      if (function->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        this->codeRunning = false;
        this->callContinue = false;
        NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                           "ERROR: external raw function calls are disabled");
        this->execErrorMessage = this->execErrorBuffer;
        (this->execErrorObject).typeID = 0;
        (this->execErrorObject).ptr = (char *)0x0;
        bVar13 = 1;
      }
      else {
        (*function->funcPtrWrap)(function->funcPtrWrapTarget,(char *)__dest,(char *)__dest);
        bVar13 = this->callContinue ^ 1;
      }
    }
    else {
      if ((this->exLinker->exRegVmCode).count <= uVar10) goto LAB_00243620;
      instruction = (this->exLinker->exRegVmCode).data + uVar10;
      uVar10 = function->argumentSize;
      uVar3 = (this->dataStack).count;
      uVar9 = 0x10 - (uVar3 & 0xf);
      if ((uVar3 & 0xf) == 0) {
        uVar9 = 0;
      }
      if (uVar3 + uVar9 + uVar10 < (this->dataStack).max) {
        memcpy((this->dataStack).data + (ulong)uVar9 + (ulong)uVar3,arguments,(ulong)uVar10);
        uVar3 = (this->dataStack).count;
        if ((uVar3 & 0xf) != 0) {
          __assert_fail("dataStack.size() % 16 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0xf6,"bool ExecutorRegVm::Run(unsigned int, const char *)");
        }
        uVar9 = function->stackSize + 0xf & 0xfffffff0;
        regFilePtr = &this->regFileLastTop->field_0;
        iVar5 = function->regVmRegisters;
        uVar3 = uVar3 + uVar9;
        if (uVar3 < (this->dataStack).max) {
          (this->dataStack).count = uVar3;
          if (uVar9 < uVar10) {
            __assert_fail("argumentsSize <= stackSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x103,"bool ExecutorRegVm::Run(unsigned int, const char *)");
          }
          aVar11 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
          if (uVar9 != uVar10) {
            memset((void *)(aVar11.longValue + (ulong)uVar6 + (ulong)uVar10),0,
                   (ulong)(uVar9 - uVar10));
            aVar11 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
          }
          *regFilePtr = aVar11;
          regFilePtr[1].longValue = (int64_t)((this->dataStack).data + uVar6);
          regFilePtr[2] =
               (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data;
          regFilePtr[3].longValue = (int64_t)regFilePtr;
        }
        else {
          local_38 = instruction + 1;
          uVar10 = (this->callStack).count;
          if (uVar10 == (this->callStack).max) {
            FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar10,&local_38);
          }
          else {
            (this->callStack).count = uVar10 + 1;
            (this->callStack).data[uVar10] = local_38;
          }
          instruction = (RegVmCmd *)0x0;
          this->codeRunning = false;
          this->callContinue = false;
          NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: stack overflow");
          this->execErrorMessage = this->execErrorBuffer;
          (this->execErrorObject).typeID = 0;
          (this->execErrorObject).ptr = (char *)0x0;
          local_54 = rvrError;
        }
        paVar14 = regFilePtr + iVar5;
        sVar8 = (long)iVar5 * 8 - 0x20;
        goto LAB_002433f1;
      }
      local_38 = instruction + 1;
      uVar10 = (this->callStack).count;
      if (uVar10 == (this->callStack).max) {
        FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar10,&local_38);
      }
      else {
        (this->callStack).count = uVar10 + 1;
        (this->callStack).data[uVar10] = local_38;
      }
      bVar13 = 0;
      this->codeRunning = false;
      this->callContinue = false;
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: stack overflow");
      this->execErrorMessage = this->execErrorBuffer;
      (this->execErrorObject).typeID = 0;
      (this->execErrorObject).ptr = (char *)0x0;
      local_54 = rvrError;
    }
    pRVar12 = this->regFileLastTop;
    RVar4 = local_54;
    goto LAB_0024343c;
  }
  pcVar15 = 
  "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_0024364c:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,pcVar15);
}

Assistant:

bool ExecutorRegVm::Run(unsigned functionID, const char *arguments)
{
	if(exLinker->exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	if(!codeRunning || functionID == ~0u)
		InitExecution();

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	codeBase = &exLinker->exRegVmCode[0];
	RegVmCmd *instruction = &exLinker->exRegVmCode[0];

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = callStack.size();

	unsigned prevDataSize = dataStack.size();

	RegVmRegister *regFilePtr = regFileLastTop;
	RegVmRegister *regFileTop = regFilePtr + 256;

	unsigned *tempStackPtr = tempStackArrayBase;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Copy all arguments
			memcpy(tempStackPtr, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

				if(!callContinue)
					errorState = true;
			}
			else
			{
				if(!RunExternalFunction(functionID, tempStackPtr))
					errorState = true;
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instruction = NULL;
		}
		else
		{
			instruction = &exLinker->exRegVmCode[funcPos];

			unsigned argumentsSize = target.argumentSize;

			// Keep stack frames aligned to 16 byte boundary
			unsigned alignOffset = (dataStack.size() % 16 != 0) ? (16 - (dataStack.size() % 16)) : 0;

			if(dataStack.size() + alignOffset + argumentsSize >= dataStack.max)
			{
				callStack.push_back(instruction + 1);
				instruction = NULL;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				memcpy((char*)(dataStack.data + dataStack.size() + alignOffset), arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				regFilePtr = regFileLastTop;
				regFileTop = regFilePtr + target.regVmRegisters;

				assert(dataStack.size() % 16 == 0);

				if(dataStack.size() + stackSize >= dataStack.max)
				{
					callStack.push_back(instruction + 1);
					instruction = NULL;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					dataStack.resize(dataStack.size() + stackSize);

					assert(argumentsSize <= stackSize);

					if(stackSize - argumentsSize)
						memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}

				memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(dataStack.size() >= exLinker->globalVarSize);
		memset(dataStack.data, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(dataStack.data);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		memset(regFilePtr + rvrrCount, 0, (regFileTop - regFilePtr - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFileLastTop = regFileLastTop;

	regFileLastTop = regFileTop;

	RegVmReturnType resultType = retType;

	if(instruction)
		resultType = RunCode(instruction, regFilePtr, this, codeBase);

	regFileLastTop = prevRegFileLastTop;

	dataStack.shrink(prevDataSize);

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}